

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

PStruct * FindStructType(FName *name)

{
  PClass *pPVar1;
  PType *pPVar2;
  FName local_c;
  
  local_c = (FName)name->Index;
  pPVar1 = PClass::FindClass(&local_c);
  if (pPVar1 == (PClass *)0x0) {
    pPVar2 = FTypeTable::FindType
                       (&TypeTable,PStruct::RegistrationInfo.MyClass,0,(long)name->Index,
                        (size_t *)0x0);
    pPVar1 = (PClass *)dyn_cast<PStruct>((DObject *)pPVar2);
    if (pPVar1 == (PClass *)0x0) {
      pPVar2 = FTypeTable::FindType
                         (&TypeTable,PNativeStruct::RegistrationInfo.MyClass,0,(long)name->Index,
                          (size_t *)0x0);
      pPVar1 = (PClass *)dyn_cast<PStruct>((DObject *)pPVar2);
    }
  }
  return (PStruct *)pPVar1;
}

Assistant:

static PStruct *FindStructType(FName name)
{
	PStruct *ccls = PClass::FindClass(name);
	if (ccls == nullptr)
	{
		ccls = dyn_cast<PStruct>(TypeTable.FindType(RUNTIME_CLASS(PStruct), 0, (intptr_t)name, nullptr));
		if (ccls == nullptr) ccls = dyn_cast<PStruct>(TypeTable.FindType(RUNTIME_CLASS(PNativeStruct), 0, (intptr_t)name, nullptr));
	}
	return ccls;
}